

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption.cc
# Opt level: O0

encryption_ops * get_encryption_ops(fdb_encryption_algorithm_t algorithm)

{
  fdb_encryption_algorithm_t algorithm_local;
  encryption_ops *local_8;
  
  if (algorithm == -1) {
    local_8 = &bogus_ops;
  }
  else if (algorithm == 1) {
    local_8 = (encryption_ops *)0x0;
  }
  else {
    local_8 = (encryption_ops *)0x0;
  }
  return local_8;
}

Assistant:

const encryption_ops* get_encryption_ops(fdb_encryption_algorithm_t algorithm) {
    switch (algorithm) {
        case FDB_ENCRYPTION_AES256:
            return fdb_encryption_ops_aes;
        case FDB_ENCRYPTION_BOGUS:
            return fdb_encryption_ops_bogus;
        default:
            return NULL;
    }
}